

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Degree_Generator.cc
# Opt level: O2

int __thiscall Degree_Generator::deg_generator(Degree_Generator *this,int v)

{
  long lVar1;
  long lVar2;
  
  if ((uint)v < 0x100000) {
    for (lVar2 = 0;
        (lVar1 = 7, lVar2 != 7 &&
        (((uint)v < f_table[lVar2] || (lVar1 = lVar2, f_table[lVar2 + 1] <= (uint)v))));
        lVar2 = lVar2 + 1) {
    }
    return d_table[lVar1];
  }
  return -1;
}

Assistant:

int Degree_Generator::deg_generator(int v)
{
	int index_d = 0;
	int deg = 0;
	// v is a non-negative integer that is less than 2^^20 = 1048576
	// please refer to rfc6330 5.3.5.2 degree generator
	if ((v >= 1048576) || (v < 0) )
	{
		return -1;
	}

	// choose the degree: lookup the f_tabole
	for(index_d = 1; index_d < 8; index_d++)
	{
		if((f_table[index_d - 1] <= v) && (v < f_table[index_d]))
		{
		     break;
		}
	}

	if (index_d > 8)
	{
		std::cerr << "Inconsistent table state" << std::endl;
	}

	deg = d_table[index_d - 1];

	return deg;

}